

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_catalog_entry.cpp
# Opt level: O2

void __thiscall
duckdb::SchemaCatalogEntry::SchemaCatalogEntry
          (SchemaCatalogEntry *this,Catalog *catalog,CreateSchemaInfo *info)

{
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)&(info->super_CreateInfo).schema);
  InCatalogEntry::InCatalogEntry(&this->super_InCatalogEntry,SCHEMA_ENTRY,catalog,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  (this->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)&PTR__InCatalogEntry_027ac1d0;
  (this->super_InCatalogEntry).super_CatalogEntry.internal = (info->super_CreateInfo).internal;
  Value::operator=(&(this->super_InCatalogEntry).super_CatalogEntry.comment,
                   &(info->super_CreateInfo).comment);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(this->super_InCatalogEntry).super_CatalogEntry.tags,
              &(info->super_CreateInfo).tags._M_h);
  return;
}

Assistant:

SchemaCatalogEntry::SchemaCatalogEntry(Catalog &catalog, CreateSchemaInfo &info)
    : InCatalogEntry(CatalogType::SCHEMA_ENTRY, catalog, info.schema) {
	this->internal = info.internal;
	this->comment = info.comment;
	this->tags = info.tags;
}